

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_vendorio.cpp
# Opt level: O0

void __thiscall StreamVendorIo::PrintErrorMessage(StreamVendorIo *this,char *fmt,...)

{
  char in_AL;
  ostream *poVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_40;
  char *formatted;
  va_list args;
  char *fmt_local;
  StreamVendorIo *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  formatted._4_4_ = 0x30;
  formatted._0_4_ = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  vasprintf(&local_40,fmt,&formatted);
  poVar1 = std::operator<<(this->os,"Error: ");
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void StreamVendorIo::PrintErrorMessage(const char *fmt, ...) {
    va_list args;
    char *formatted;
    va_start(args, fmt);
    vasprintf(&formatted, fmt, args);
    os << "Error: " << formatted << "." << endl;
    va_end(args);
}